

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

void __thiscall flow::BasicBlock::merge_back(BasicBlock *this,BasicBlock *bb)

{
  pointer puVar1;
  Instr *pIVar2;
  pointer ppVVar3;
  pointer ppBVar4;
  TerminateInstr *pTVar5;
  long lVar6;
  BasicBlock *successor;
  pointer ppVVar7;
  pointer ppBVar8;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *instr;
  pointer __args;
  
  pTVar5 = getTerminator(this);
  if (pTVar5 == (TerminateInstr *)0x0) {
    puVar1 = (bb->code_).
             super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (bb->code_).
                  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != puVar1; __args = __args + 1)
    {
      ((__args->_M_t).super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
       super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
       super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl)->basicBlock_ = this;
      pIVar2 = (__args->_M_t).super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>.
               _M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
               super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
      if (pIVar2 != (Instr *)0x0) {
        lVar6 = __dynamic_cast(pIVar2,&Instr::typeinfo,&TerminateInstr::typeinfo,0);
        if (lVar6 != 0) {
          ppVVar3 = *(pointer *)
                     ((long)&(pIVar2->operands_).
                             super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> + 8);
          for (ppVVar7 = *(pointer *)
                          &(pIVar2->operands_).
                           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl
              ; ppVVar7 != ppVVar3; ppVVar7 = ppVVar7 + 1) {
            if (*ppVVar7 != (Value *)0x0) {
              successor = (BasicBlock *)__dynamic_cast(*ppVVar7,&Value::typeinfo,&typeinfo,0);
              if (successor != (BasicBlock *)0x0) {
                unlinkSuccessor(bb,successor);
                linkSuccessor(this,successor);
              }
            }
          }
        }
      }
      std::
      vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>
      ::emplace_back<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>
                ((vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>
                  *)&this->code_,__args);
    }
    std::
    vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
    ::clear(&bb->code_);
    ppBVar4 = (bb->successors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar8 = (bb->successors_).
                   super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar4;
        ppBVar8 = ppBVar8 + 1) {
      unlinkSuccessor(this,*ppBVar8);
    }
    IRHandler::erase(bb->handler_,bb);
    return;
  }
  __assert_fail("getTerminator() == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,0x89,"void flow::BasicBlock::merge_back(BasicBlock *)");
}

Assistant:

void BasicBlock::merge_back(BasicBlock* bb) {
  assert(getTerminator() == nullptr);

#if 0
  for (const std::unique_ptr<Instr>& instr : bb->code_) {
    push_back(instr->clone());
  }
#else
  for (std::unique_ptr<Instr>& instr : bb->code_) {
    instr->setParent(this);
    if (dynamic_cast<TerminateInstr*>(instr.get())) {
      // then check for possible successors
      for (Value* operand : instr->operands()) {
        if (auto succ = dynamic_cast<BasicBlock*>(operand)) {
          bb->unlinkSuccessor(succ);
          linkSuccessor(succ);
        }
      }
    }
    code_.push_back(std::move(instr));
  }
  bb->code_.clear();
  for (BasicBlock* succ : bb->successors_) {
    unlinkSuccessor(succ);
  }
  bb->getHandler()->erase(bb);
#endif
}